

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int analyze_tx(uchar *bytes,size_t bytes_len,uint32_t flags,size_t *num_inputs,size_t *num_outputs,
              _Bool *expect_witnesses)

{
  _Bool _Var1;
  uint uVar2;
  size_t sVar3;
  uchar *puVar4;
  byte *pbVar5;
  byte local_b9;
  uint local_b0;
  byte local_aa;
  byte local_a9;
  uint32_t utxo_index;
  _Bool expect_issuance;
  _Bool is_elements;
  wally_tx tmp_tx;
  size_t j;
  size_t i;
  uint64_t num_witnesses;
  uint64_t v;
  uchar *end;
  uchar *p;
  _Bool *expect_witnesses_local;
  size_t *num_outputs_local;
  size_t *num_inputs_local;
  size_t sStack_20;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  v = (uint64_t)(bytes + bytes_len);
  local_a9 = (flags & 2) != 0;
  if (num_inputs != (size_t *)0x0) {
    *num_inputs = 0;
  }
  if (num_outputs != (size_t *)0x0) {
    *num_outputs = 0;
  }
  if (expect_witnesses != (_Bool *)0x0) {
    *expect_witnesses = false;
  }
  if (((((bytes == (uchar *)0x0) || (bytes_len < 6)) || ((flags & 0xfffffff0) != 0)) ||
      ((num_inputs == (size_t *)0x0 || (num_outputs == (size_t *)0x0)))) ||
     (expect_witnesses == (_Bool *)0x0)) {
    bytes_local._4_4_ = -2;
  }
  else {
    end = bytes;
    p = expect_witnesses;
    expect_witnesses_local = (_Bool *)num_outputs;
    num_outputs_local = num_inputs;
    num_inputs_local._4_4_ = flags;
    sStack_20 = bytes_len;
    bytes_len_local = (size_t)bytes;
    sVar3 = uint32_from_le_bytes(bytes,&utxo_index);
    end = end + sVar3;
    if ((local_a9 & 1) == 0) {
      if (((num_inputs_local._4_4_ & 8) == 0) && (*end == '\0')) {
        if (end[1] != '\x01') {
          return -2;
        }
        end = end + 2;
        *p = '\x01';
      }
    }
    else {
      if ((num_inputs_local._4_4_ & 8) != 0) {
        return -2;
      }
      *p = *end != '\0';
      end = end + 1;
    }
    puVar4 = end;
    if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
      bytes_local._4_4_ = -2;
    }
    else {
      sVar3 = varint_from_bytes(end,&num_witnesses);
      end = end + sVar3;
      *num_outputs_local = num_witnesses;
      for (j = 0; puVar4 = end, j < *num_outputs_local; j = j + 1) {
        if ((v < end) || (v < end + 0x24)) {
          return -2;
        }
        uint32_from_le_bytes(end + 0x20,&local_b0);
        local_b9 = 0;
        if (((local_a9 & 1) != 0) && (local_b9 = 0, (local_b0 & 0x80000000) != 0)) {
          _Var1 = is_coinbase_bytes(end,0x20,local_b0);
          local_b9 = _Var1 ^ 0xff;
        }
        local_aa = local_b9 & 1;
        puVar4 = end + 0x24;
        if ((v < puVar4) ||
           (end = puVar4, sVar3 = varint_length_from_bytes(puVar4), v < puVar4 + sVar3)) {
          return -2;
        }
        sVar3 = varint_from_bytes(end,&num_witnesses);
        puVar4 = end + sVar3;
        if ((v < puVar4) || (v < puVar4 + num_witnesses)) {
          return -2;
        }
        puVar4 = puVar4 + num_witnesses;
        if ((v < puVar4) || (v < puVar4 + 4)) {
          return -2;
        }
        end = puVar4 + 4;
        if ((local_aa & 1) != 0) {
          if ((v < end) || (v < puVar4 + 0x44)) {
            return -2;
          }
          pbVar5 = puVar4 + 0x44;
          uVar2 = (uint)*pbVar5;
          if (uVar2 == 0) {
            if ((v < pbVar5) || (v < puVar4 + 0x45)) {
              return -2;
            }
            end = puVar4 + 0x45;
          }
          else if (uVar2 == 1) {
            if ((v < pbVar5) || (v < puVar4 + 0x4d)) {
              return -2;
            }
            end = puVar4 + 0x4d;
          }
          else {
            if (1 < uVar2 - 8) {
              return -2;
            }
            if ((v < pbVar5) || (v < puVar4 + 0x65)) {
              return -2;
            }
            end = puVar4 + 0x65;
          }
          uVar2 = (uint)*end;
          if (uVar2 == 0) {
            if ((v < end) || (v < end + 1)) {
              return -2;
            }
            end = end + 1;
          }
          else if (uVar2 == 1) {
            if ((v < end) || (v < end + 9)) {
              return -2;
            }
            end = end + 9;
          }
          else {
            if (1 < uVar2 - 8) {
              return -2;
            }
            if ((v < end) || (v < end + 0x21)) {
              return -2;
            }
            end = end + 0x21;
          }
        }
      }
      if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
        bytes_local._4_4_ = -2;
      }
      else {
        sVar3 = varint_from_bytes(end,&num_witnesses);
        end = end + sVar3;
        *(uint64_t *)expect_witnesses_local = num_witnesses;
        for (j = 0; j < *(ulong *)expect_witnesses_local; j = j + 1) {
          if ((local_a9 & 1) == 0) {
            if ((v < end) || (v < end + 8)) {
              return -2;
            }
            end = end + 8;
          }
          else {
            uVar2 = (uint)*end;
            if (uVar2 == 0) {
              if ((v < end) || (v < end + 1)) {
                return -2;
              }
              end = end + 1;
            }
            else if (uVar2 == 1) {
              if ((v < end) || (v < end + 0x21)) {
                return -2;
              }
              end = end + 0x21;
            }
            else {
              if (1 < uVar2 - 10) {
                return -2;
              }
              if ((v < end) || (v < end + 0x21)) {
                return -2;
              }
              end = end + 0x21;
            }
            uVar2 = (uint)*end;
            if (uVar2 == 0) {
              if ((v < end) || (v < end + 1)) {
                return -2;
              }
              end = end + 1;
            }
            else if (uVar2 == 1) {
              if ((v < end) || (v < end + 9)) {
                return -2;
              }
              end = end + 9;
            }
            else {
              if (1 < uVar2 - 8) {
                return -2;
              }
              if ((v < end) || (v < end + 0x21)) {
                return -2;
              }
              end = end + 0x21;
            }
            uVar2 = (uint)*end;
            if (uVar2 == 0) {
              if ((v < end) || (v < end + 1)) {
                return -2;
              }
              end = end + 1;
            }
            else if (uVar2 == 1) {
              if ((v < end) || (v < end + 0x21)) {
                return -2;
              }
              end = end + 0x21;
            }
            else {
              if (1 < uVar2 - 2) {
                return -2;
              }
              if ((v < end) || (v < end + 0x21)) {
                return -2;
              }
              end = end + 0x21;
            }
          }
          puVar4 = end;
          if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
            return -2;
          }
          sVar3 = varint_from_bytes(end,&num_witnesses);
          puVar4 = end + sVar3;
          if ((v < puVar4) || (v < puVar4 + num_witnesses)) {
            return -2;
          }
          end = puVar4 + num_witnesses;
        }
        if (((*p & 1) != 0) && ((local_a9 & 1) == 0)) {
          for (j = 0; puVar4 = end, j < *num_outputs_local; j = j + 1) {
            if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
              return -2;
            }
            sVar3 = varint_from_bytes(end,&i);
            end = end + sVar3;
            for (tmp_tx.outputs_allocation_len = 0; puVar4 = end, tmp_tx.outputs_allocation_len < i;
                tmp_tx.outputs_allocation_len = tmp_tx.outputs_allocation_len + 1) {
              if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
                return -2;
              }
              sVar3 = varint_from_bytes(end,&num_witnesses);
              puVar4 = end + sVar3;
              if ((v < puVar4) || (v < puVar4 + num_witnesses)) {
                return -2;
              }
              end = puVar4 + num_witnesses;
            }
          }
        }
        if ((v < end) || (v < end + 4)) {
          bytes_local._4_4_ = -2;
        }
        else {
          if (((*p & 1) != 0) && ((local_a9 & 1) != 0)) {
            end = end + 4;
            for (j = 0; puVar4 = end, j < *num_outputs_local; j = j + 1) {
              if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
                return -2;
              }
              sVar3 = varint_from_bytes(end,&num_witnesses);
              puVar4 = end + sVar3;
              if ((v < puVar4) || (v < puVar4 + num_witnesses)) {
                return -2;
              }
              puVar4 = puVar4 + num_witnesses;
              if ((v < puVar4) ||
                 (end = puVar4, sVar3 = varint_length_from_bytes(puVar4), v < puVar4 + sVar3)) {
                return -2;
              }
              sVar3 = varint_from_bytes(end,&num_witnesses);
              puVar4 = end + sVar3;
              if ((v < puVar4) || (v < puVar4 + num_witnesses)) {
                return -2;
              }
              puVar4 = puVar4 + num_witnesses;
              if ((v < puVar4) ||
                 (end = puVar4, sVar3 = varint_length_from_bytes(puVar4), v < puVar4 + sVar3)) {
                return -2;
              }
              sVar3 = varint_from_bytes(end,&i);
              end = end + sVar3;
              for (tmp_tx.outputs_allocation_len = 0; puVar4 = end,
                  tmp_tx.outputs_allocation_len < i;
                  tmp_tx.outputs_allocation_len = tmp_tx.outputs_allocation_len + 1) {
                if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
                  return -2;
                }
                sVar3 = varint_from_bytes(end,&num_witnesses);
                puVar4 = end + sVar3;
                if ((v < puVar4) || (v < puVar4 + num_witnesses)) {
                  return -2;
                }
                end = puVar4 + num_witnesses;
              }
              if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
                return -2;
              }
              sVar3 = varint_from_bytes(end,&i);
              end = end + sVar3;
              for (tmp_tx.outputs_allocation_len = 0; puVar4 = end,
                  tmp_tx.outputs_allocation_len < i;
                  tmp_tx.outputs_allocation_len = tmp_tx.outputs_allocation_len + 1) {
                if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
                  return -2;
                }
                sVar3 = varint_from_bytes(end,&num_witnesses);
                puVar4 = end + sVar3;
                if ((v < puVar4) || (v < puVar4 + num_witnesses)) {
                  return -2;
                }
                end = puVar4 + num_witnesses;
              }
            }
            for (j = 0; puVar4 = end, j < *(ulong *)expect_witnesses_local; j = j + 1) {
              if ((v < end) || (sVar3 = varint_length_from_bytes(end), v < puVar4 + sVar3)) {
                return -2;
              }
              sVar3 = varint_from_bytes(end,&num_witnesses);
              puVar4 = end + sVar3;
              if ((v < puVar4) || (v < puVar4 + num_witnesses)) {
                return -2;
              }
              puVar4 = puVar4 + num_witnesses;
              if ((v < puVar4) ||
                 (end = puVar4, sVar3 = varint_length_from_bytes(puVar4), v < puVar4 + sVar3)) {
                return -2;
              }
              sVar3 = varint_from_bytes(end,&num_witnesses);
              puVar4 = end + sVar3;
              if ((v < puVar4) || (v < puVar4 + num_witnesses)) {
                return -2;
              }
              end = puVar4 + num_witnesses;
            }
          }
          bytes_local._4_4_ = 0;
        }
      }
    }
  }
  return bytes_local._4_4_;
}

Assistant:

static int analyze_tx(const unsigned char *bytes, size_t bytes_len,
                      uint32_t flags, size_t *num_inputs, size_t *num_outputs,
                      bool *expect_witnesses)
{
    const unsigned char *p = bytes, *end = bytes + bytes_len;
    uint64_t v, num_witnesses;
    size_t i, j;
    struct wally_tx tmp_tx;
    const bool is_elements = flags & WALLY_TX_FLAG_USE_ELEMENTS;

    if (num_inputs)
        *num_inputs = 0;
    if (num_outputs)
        *num_outputs = 0;
    if (expect_witnesses)
        *expect_witnesses = false;

    if (!bytes || bytes_len < sizeof(uint32_t) + 2 || (flags & ~WALLY_TX_ALL_FLAGS) ||
        !num_inputs || !num_outputs || !expect_witnesses)
        return WALLY_EINVAL;

    p += uint32_from_le_bytes(p, &tmp_tx.version);

    if (is_elements) {
        if (flags & WALLY_TX_FLAG_PRE_BIP144)
            return WALLY_EINVAL; /* No pre-BIP 144 serialisation for elements */
        *expect_witnesses = *p++ != 0;
    } else {
        if (!(flags & WALLY_TX_FLAG_PRE_BIP144) && *p == 0) {
            /* BIP 144 extended serialization */
            if (p[1] != 0x1)
                return WALLY_EINVAL; /* Invalid witness flag */
            p += 2;
            *expect_witnesses = true;
        }
    }

#define ensure_n(n) if (p > end || p + (n) > end) return WALLY_EINVAL

#define ensure_varint(dst) ensure_n(varint_length_from_bytes(p)); \
    p += varint_from_bytes(p, (dst))

#define ensure_varbuff(dst) ensure_varint((dst)); \
    ensure_n(*dst)

#define ensure_commitment(dst, explicit_siz, prefix_a, prefix_b) \
    switch (*dst) { \
    case 0: \
        ensure_n(sizeof(uint8_t)); \
        p++; \
        break; \
    case 1: \
        ensure_n(explicit_siz); \
        p += explicit_siz; \
        break; \
    case prefix_a: \
    case prefix_b: \
        ensure_n(WALLY_TX_ASSET_CT_LEN); \
        p += WALLY_TX_ASSET_CT_LEN; \
        break; \
    default: \
        return WALLY_EINVAL; \
    }

#define ensure_committed_value(dst) \
    ensure_commitment(dst, WALLY_TX_ASSET_CT_VALUE_UNBLIND_LEN, WALLY_TX_ASSET_CT_VALUE_PREFIX_A, WALLY_TX_ASSET_CT_VALUE_PREFIX_B)

#define ensure_committed_asset(dst) \
    ensure_commitment(dst, WALLY_TX_ASSET_CT_ASSET_LEN, WALLY_TX_ASSET_CT_ASSET_PREFIX_A, WALLY_TX_ASSET_CT_ASSET_PREFIX_B)

#define ensure_committed_nonce(dst) \
    ensure_commitment(dst, WALLY_TX_ASSET_CT_NONCE_LEN, WALLY_TX_ASSET_CT_NONCE_PREFIX_A, WALLY_TX_ASSET_CT_NONCE_PREFIX_B)

    ensure_varint(&v);
    *num_inputs = v;

    for (i = 0; i < *num_inputs; ++i) {
        bool expect_issuance;
        uint32_t utxo_index;
        ensure_n(WALLY_TXHASH_LEN + sizeof(uint32_t));
        uint32_from_le_bytes(p + WALLY_TXHASH_LEN, &utxo_index);
        expect_issuance = is_elements && (utxo_index & WALLY_TX_ISSUANCE_FLAG) && !is_coinbase_bytes(p, WALLY_TXHASH_LEN, utxo_index);
        p += WALLY_TXHASH_LEN + sizeof(uint32_t);
        ensure_varbuff(&v);
        /* FIXME: Analyze script types if required */
        p += v;
        ensure_n(sizeof(uint32_t));
        p += sizeof(uint32_t);
        if (expect_issuance) {
            ensure_n(2 * WALLY_TX_ASSET_TAG_LEN);
            p += 2 * WALLY_TX_ASSET_TAG_LEN;
            ensure_committed_value(p); /* issuance amount */
            ensure_committed_value(p); /* inflation keys */
        }
    }

    ensure_varint(&v);
    *num_outputs = v;

    for (i = 0; i < *num_outputs; ++i) {
        if (is_elements) {
            ensure_committed_asset(p);
            ensure_committed_value(p);
            ensure_committed_nonce(p);
        } else {
            ensure_n(sizeof(uint64_t));
            p += sizeof(uint64_t);
        }
        ensure_varbuff(&v);
        /* FIXME: Analyze script types if required */
        p += v;
    }

    if (*expect_witnesses && !is_elements) {
        for (i = 0; i < *num_inputs; ++i) {
            ensure_varint(&num_witnesses);
            for (j = 0; j < num_witnesses; ++j) {
                ensure_varbuff(&v);
                p += v;
            }
        }
    }

    ensure_n(sizeof(uint32_t)); /* Locktime */

    if (*expect_witnesses && is_elements) {
        p += sizeof(uint32_t);
        for (i = 0; i < *num_inputs; ++i) {
            ensure_varbuff(&v); /* issuance amount rangeproof */
            p += v;
            ensure_varbuff(&v); /* inflation keys rangeproof */
            p += v;
            ensure_varint(&num_witnesses); /* scriptWitness */
            for (j = 0; j < num_witnesses; ++j) {
                ensure_varbuff(&v);
                p += v;
            }
            ensure_varint(&num_witnesses); /* peginWitness */
            for (j = 0; j < num_witnesses; ++j) {
                ensure_varbuff(&v);
                p += v;
            }
        }

        for (i = 0; i < *num_outputs; ++i) {
            ensure_varbuff(&v); /* surjection proof */
            p += v;
            ensure_varbuff(&v); /* range proof */
            p += v;
        }
    }

#undef ensure_n
#undef ensure_varint
#undef ensure_varbuff
#undef ensure_commitment
#undef ensure_committed_value
#undef ensure_committed_asset
#undef ensure_committed_nonce
    return WALLY_OK;
}